

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O0

bool __thiscall SessionObjectStore::deleteObject(SessionObjectStore *this,SessionObject *object)

{
  bool bVar1;
  undefined8 in_RSI;
  MutexLocker *in_RDI;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  *in_stack_ffffffffffffffa8;
  _Self local_48 [3];
  _Self local_30 [3];
  undefined8 local_18;
  bool local_1;
  
  local_18 = in_RSI;
  MutexLocker::MutexLocker(in_RDI,in_stack_ffffffffffffff98);
  local_30[0]._M_node =
       (_Base_ptr)
       std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::find
                 (in_stack_ffffffffffffffa8,(key_type *)in_RDI);
  local_48[0]._M_node =
       (_Base_ptr)
       std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::end
                 ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
                   *)in_stack_ffffffffffffff98);
  bVar1 = std::operator==(local_30,local_48);
  if (bVar1) {
    softHSMLog(3,"deleteObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObjectStore.cpp"
               ,0x88,"Cannot delete non-existent object 0x%08X",local_18);
  }
  else {
    SessionObject::invalidate((SessionObject *)0x1e57e5);
    std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::erase
              ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *
               )in_RDI,(key_type *)in_stack_ffffffffffffff98);
  }
  local_1 = !bVar1;
  MutexLocker::~MutexLocker(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool SessionObjectStore::deleteObject(SessionObject* object)
{
	MutexLocker lock(storeMutex);

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	object->invalidate();

	objects.erase(object);

	return true;
}